

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_serialize_der
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_ecdsa_signature *sig
              )

{
  secp256k1_ecdsa_signature *in_RCX;
  long in_RDX;
  long in_RSI;
  secp256k1_context *in_RDI;
  secp256k1_scalar s;
  secp256k1_scalar r;
  char *in_stack_ffffffffffffff98;
  secp256k1_callback *in_stack_ffffffffffffffa0;
  secp256k1_scalar local_48 [2];
  int local_4;
  
  if (in_RDI == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x199,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else if (in_RCX == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else {
    secp256k1_ecdsa_signature_load
              (in_RDI,local_48,(secp256k1_scalar *)&stack0xffffffffffffff98,in_RCX);
    local_4 = secp256k1_ecdsa_sig_serialize
                        ((uchar *)r.d[3],(size_t *)r.d[2],(secp256k1_scalar *)r.d[1],
                         (secp256k1_scalar *)r.d[0]);
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_der(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return secp256k1_ecdsa_sig_serialize(output, outputlen, &r, &s);
}